

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatumSpecification.cpp
# Opt level: O0

void __thiscall DIS::DatumSpecification::marshal(DatumSpecification *this,DataStream *dataStream)

{
  pointer pEVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer pEVar5;
  const_reference pvVar6;
  undefined1 local_78 [8];
  VariableDatum x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  FixedDatum x;
  size_t idx;
  DataStream *dataStream_local;
  DatumSpecification *this_local;
  
  sVar3 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                    (&this->_fixedDatumIDList);
  DataStream::operator<<(dataStream,(uint)sVar3);
  sVar3 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                    (&this->_variableDatumIDList);
  DataStream::operator<<(dataStream,(uint)sVar3);
  x._fixedDatumID = 0;
  x._fixedDatumValue = 0;
  while( true ) {
    uVar2 = x._8_8_;
    sVar3 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatumIDList);
    if (sVar3 <= (ulong)uVar2) break;
    pvVar4 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatumIDList,x._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar4);
    FixedDatum::marshal((FixedDatum *)local_30,dataStream);
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._variableDatums.super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pEVar1 = x_1._variableDatums.
             super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pEVar5 = (pointer)std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                                (&this->_variableDatumIDList);
    if (pEVar5 <= pEVar1) break;
    pvVar6 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatumIDList,
                        (size_type)
                        x_1._variableDatums.
                        super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar6);
    VariableDatum::marshal((VariableDatum *)local_78,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    x_1._variableDatums.
    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(x_1._variableDatums.
                           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_EightByteChunk
                  + 1);
  }
  return;
}

Assistant:

void DatumSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_fixedDatumIDList.size();
    dataStream << ( unsigned int )_variableDatumIDList.size();

     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        FixedDatum x = _fixedDatumIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        VariableDatum x = _variableDatumIDList[idx];
        x.marshal(dataStream);
     }

}